

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

bool __thiscall BCLog::Logger::StartLogging(Logger *this)

{
  int iVar1;
  string_view str;
  string_view str_00;
  time_point now;
  string_view source_file;
  string_view logging_function;
  string_view threadname;
  bool bVar2;
  reference pvVar3;
  char *__ptr;
  size_type __n;
  string *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var4;
  __sv_type _Var5;
  char *unaff_retaddr;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *cb;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *__range2;
  value_type *buflog;
  iterator __end2;
  iterator __begin2;
  LogFlags in_stack_00000100;
  Level in_stack_00000108;
  StdLockGuard scoped_lock;
  string s;
  path *in_stack_fffffffffffffe58;
  undefined4 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  FILE *in_stack_fffffffffffffe68;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  unsigned_long *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  Level level;
  FILE *in_stack_fffffffffffffec8;
  Logger *in_stack_fffffffffffffed8;
  seconds mocktime;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar9;
  iterator in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_98;
  undefined1 in_stack_ffffffffffffff70 [16];
  undefined1 auVar10 [12];
  path *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_78;
  undefined8 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  string_view in_stack_ffffffffffffffe8;
  size_t sVar11;
  
  auVar10 = in_stack_ffffffffffffff70._4_12_;
  sVar11 = *(size_t *)(in_FS_OFFSET + 0x28);
  mocktime.__r = (rep)in_RDI;
  StdLockGuard::StdLockGuard((StdLockGuard *)in_stack_fffffffffffffe58,(StdMutex *)0xfe665e);
  if ((in_RDI[2]._M_string_length & 1) == 0) {
    __assert_fail("m_buffering",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x37,"bool BCLog::Logger::StartLogging()");
  }
  if (in_RDI[1]._M_string_length != 0) {
    __assert_fail("m_fileout == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x38,"bool BCLog::Logger::StartLogging()");
  }
  pbStack_98 = in_stack_fffffffffffffe78;
  if ((in_RDI[6].field_2._M_local_buf[1] & 1U) != 0) {
    bVar2 = std::filesystem::__cxx11::path::empty(in_stack_fffffffffffffe58);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!m_file_path.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                    ,0x3b,"bool BCLog::Logger::StartLogging()");
    }
    in_stack_fffffffffffffec8 = fsbridge::fopen(in_RDI[6].field_2._M_local_buf + 8,"a");
    in_RDI[1]._M_string_length = (size_type)in_stack_fffffffffffffec8;
    if (in_RDI[1]._M_string_length == 0) {
      bVar9 = 0;
      goto LAB_00fe6bd2;
    }
    setbuf((FILE *)in_RDI[1]._M_string_length,(char *)0x0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
               (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    str._M_len._4_4_ = in_stack_fffffffffffffe74;
    str._M_len._0_4_ = in_stack_fffffffffffffe70;
    str._M_str = (char *)in_stack_fffffffffffffe78;
    FileWriteStr(str,in_stack_fffffffffffffe68);
    pbStack_98 = in_stack_fffffffffffffe78;
  }
  *(undefined1 *)&in_RDI[2]._M_string_length = 0;
  if (in_RDI[3]._M_dataplus._M_p != (pointer)0x0) {
    tinyformat::format<unsigned_long>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::operator_cast_to_basic_string_view(pbStack_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)pbStack_98,
               (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)pbStack_98,
               (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    logging_function._M_str._0_4_ = in_stack_ffffffffffffffe0;
    logging_function._M_len = in_stack_ffffffffffffffd8;
    logging_function._M_str._4_4_ = in_stack_ffffffffffffffe4;
    LogPrintStr_(auVar10._4_8_,in_stack_ffffffffffffffe8,logging_function,(string_view)___begin2,
                 auVar10._0_4_,in_stack_00000100,in_stack_00000108);
    std::__cxx11::string::~string(&local_80->_M_pathname);
    in_stack_fffffffffffffe58 = local_80;
    in_stack_fffffffffffffe60 = pbStack_78;
  }
  while (bVar2 = std::__cxx11::
                 list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
                 empty((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                        *)in_stack_fffffffffffffe58), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::__cxx11::
             list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::front
                       ((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                         *)in_stack_fffffffffffffe60);
    uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    level = (Level)((ulong)pvVar3->category >> 0x20);
    std::__cxx11::string::operator_cast_to_basic_string_view(pbStack_98);
    iVar1 = pvVar3->source_line;
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(pbStack_98);
    _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(pbStack_98);
    pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var5._M_str;
    uVar7 = (undefined4)_Var5._M_len;
    uVar8 = _Var5._M_len._4_4_;
    in_stack_fffffffffffffe60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var4._M_len;
    this_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)_Var4._M_str;
    in_stack_fffffffffffffe58 = (path *)CONCAT44(uVar6,iVar1);
    source_file._M_str = (char *)in_stack_ffffffffffffff48._M_node;
    source_file._M_len = (size_t)in_stack_ffffffffffffff40._M_node;
    threadname._M_str = unaff_retaddr;
    threadname._M_len = sVar11;
    now.__d.__r._7_1_ = in_stack_ffffffffffffff3f;
    now.__d.__r._0_7_ = in_stack_ffffffffffffff38;
    FormatLogStrInPlace(in_stack_fffffffffffffed8,in_RDI,(LogFlags)in_stack_fffffffffffffec8,level,
                        source_file,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,threadname,
                        now,mocktime);
    std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
    pop_front((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *)
              this_00);
    if ((in_RDI[6].field_2._M_local_buf[1] & 1U) != 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view(pbStack_98);
      str_00._M_len._4_4_ = uVar8;
      str_00._M_len._0_4_ = uVar7;
      str_00._M_str = (char *)pbStack_98;
      FileWriteStr(str_00,(FILE *)this_00);
    }
    if ((in_RDI[6].field_2._M_local_buf[0] & 1U) != 0) {
      __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        (&in_stack_fffffffffffffe58->_M_pathname);
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&in_stack_fffffffffffffe58->_M_pathname);
      fwrite(__ptr,1,__n,_stdout);
    }
    in_stack_ffffffffffffff48 =
         std::__cxx11::
         list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
         ::begin((list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                  *)in_stack_fffffffffffffe60);
    in_stack_ffffffffffffff40 =
         std::__cxx11::
         list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
         ::end((list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                *)in_stack_fffffffffffffe60);
    while (bVar2 = std::operator==((_Self *)this_00,(_Self *)in_stack_fffffffffffffe60),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffed8 =
           (Logger *)
           std::
           _List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ::operator*((_List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                        *)in_stack_fffffffffffffe58);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(this_00,in_stack_fffffffffffffe60);
      std::
      _List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::operator++((_List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)in_stack_fffffffffffffe58);
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffe58->_M_pathname);
  }
  *(undefined8 *)((long)&in_RDI[2].field_2 + 8) = 0;
  if ((in_RDI[6].field_2._M_local_buf[0] & 1U) != 0) {
    fflush(_stdout);
  }
  bVar9 = 1;
LAB_00fe6bd2:
  StdLockGuard::~StdLockGuard((StdLockGuard *)in_stack_fffffffffffffe58);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar11) {
    __stack_chk_fail();
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool BCLog::Logger::StartLogging()
{
    StdLockGuard scoped_lock(m_cs);

    assert(m_buffering);
    assert(m_fileout == nullptr);

    if (m_print_to_file) {
        assert(!m_file_path.empty());
        m_fileout = fsbridge::fopen(m_file_path, "a");
        if (!m_fileout) {
            return false;
        }

        setbuf(m_fileout, nullptr); // unbuffered

        // Add newlines to the logfile to distinguish this execution from the
        // last one.
        FileWriteStr("\n\n\n\n\n", m_fileout);
    }

    // dump buffered messages from before we opened the log
    m_buffering = false;
    if (m_buffer_lines_discarded > 0) {
        LogPrintStr_(strprintf("Early logging buffer overflowed, %d log lines discarded.\n", m_buffer_lines_discarded), __func__, __FILE__, __LINE__, BCLog::ALL, Level::Info);
    }
    while (!m_msgs_before_open.empty()) {
        const auto& buflog = m_msgs_before_open.front();
        std::string s{buflog.str};
        FormatLogStrInPlace(s, buflog.category, buflog.level, buflog.source_file, buflog.source_line, buflog.logging_function, buflog.threadname, buflog.now, buflog.mocktime);
        m_msgs_before_open.pop_front();

        if (m_print_to_file) FileWriteStr(s, m_fileout);
        if (m_print_to_console) fwrite(s.data(), 1, s.size(), stdout);
        for (const auto& cb : m_print_callbacks) {
            cb(s);
        }
    }
    m_cur_buffer_memusage = 0;
    if (m_print_to_console) fflush(stdout);

    return true;
}